

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDelay.c
# Opt level: O0

int If_CutSopBalancePinDelaysIntInt(Vec_Int_t *vCover,int *pTimes,int nSuppAll,char *pPerm)

{
  word wVar1;
  word local_b8;
  word FaninRes [15];
  word local_38;
  word Res;
  int Delay;
  int i;
  char *pPerm_local;
  int *piStack_18;
  int nSuppAll_local;
  int *pTimes_local;
  Vec_Int_t *vCover_local;
  
  Res._4_4_ = 0;
  _Delay = pPerm;
  pPerm_local._4_4_ = nSuppAll;
  piStack_18 = pTimes;
  pTimes_local = &vCover->nCap;
  for (; Res._4_4_ < pPerm_local._4_4_; Res._4_4_ = Res._4_4_ + 1) {
    wVar1 = If_CutPinDelayInit(Res._4_4_);
    FaninRes[(long)Res._4_4_ + -1] = wVar1;
  }
  Res._0_4_ = If_CutSopBalancePinDelaysInt
                        ((Vec_Int_t *)pTimes_local,piStack_18,&local_b8,pPerm_local._4_4_,&local_38)
  ;
  If_CutPinDelayTranslate(local_38,pPerm_local._4_4_,_Delay);
  return (int)Res;
}

Assistant:

int If_CutSopBalancePinDelaysIntInt( Vec_Int_t * vCover, int * pTimes, int nSuppAll, char * pPerm )
{
    int i, Delay;
    word Res, FaninRes[IF_MAX_FUNC_LUTSIZE];
    for ( i = 0; i < nSuppAll; i++ )
        FaninRes[i] = If_CutPinDelayInit(i);
    Delay = If_CutSopBalancePinDelaysInt( vCover, pTimes, FaninRes, nSuppAll, &Res );
    If_CutPinDelayTranslate( Res, nSuppAll, pPerm );
    return Delay;
}